

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O3

void __thiscall wasm::CodeFolding::~CodeFolding(CodeFolding *this)

{
  ~CodeFolding(this);
  operator_delete(this,0x240);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }